

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebFront.hpp
# Opt level: O1

void __thiscall
webfront::
BasicWF<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>
::onEvent(BasicWF<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>
          *this,WebLinkEvent *event)

{
  impl_type **__y;
  Code CVar1;
  int iVar2;
  _Any_data *p_Var3;
  iterator iVar4;
  undefined8 uVar5;
  WebLinkEvent *__k;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_short,_webfront::WebLink<webfront::networking::TCPNetworkingTS>_>_>,_std::_Rb_tree_iterator<std::pair<const_unsigned_short,_webfront::WebLink<webfront::networking::TCPNetworkingTS>_>_>_>
  pVar6;
  span<const_std::byte,_18446744073709551615UL> local_20;
  
  CVar1 = event->code;
  if (CVar1 == cppFunctionCalled) {
    this = (BasicWF<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>
            *)&this->cppFunctions;
    __k = (WebLinkEvent *)&event->text;
    p_Var3 = (_Any_data *)
             http::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::span<const_std::byte,_18446744073709551615UL>)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::span<const_std::byte,_18446744073709551615UL>)>_>_>_>
             ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::span<const_std::byte,_18446744073709551615UL>)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::span<const_std::byte,_18446744073709551615UL>)>_>_>_>
                   *)this,(key_type *)__k);
    local_20._M_ptr = (event->data)._M_ptr;
    local_20._M_extent._M_extent_value._0_4_ = (undefined4)(event->data)._M_extent._M_extent_value;
    local_20._M_extent._M_extent_value._4_4_ =
         *(undefined4 *)((long)&(event->data)._M_extent._M_extent_value + 4);
    if (*(long *)(p_Var3 + 1) == 0) {
LAB_00118adf:
      std::__throw_bad_function_call();
      __y = &(this->httpServer).ioContext.impl_;
      iVar4 = http::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::span<const_std::byte,_18446744073709551615UL>)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::span<const_std::byte,_18446744073709551615UL>)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::span<const_std::byte,_18446744073709551615UL>)>_>_>_>
              ::_M_lower_bound((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::span<const_std::byte,_18446744073709551615UL>)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::span<const_std::byte,_18446744073709551615UL>)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(std::span<const_std::byte,_18446744073709551615UL>)>_>_>_>
                                *)this,(_Link_type)
                                       (this->httpServer).acceptor.
                                       super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
                                       .service_,(_Base_ptr)__y,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               __k);
      if (iVar4._M_node != (_Base_ptr)__y) {
        iVar2 = http::std::__cxx11::
                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (iVar4._M_node + 1));
        if (-1 < iVar2) {
          return;
        }
      }
      uVar5 = std::__throw_out_of_range("map::at");
      __clang_call_terminate(uVar5);
    }
    (**(code **)(p_Var3->_M_pod_data + 0x18))(p_Var3,&local_20);
  }
  else {
    if (CVar1 == closed) {
      pVar6 = http::std::
              _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_webfront::WebLink<webfront::networking::TCPNetworkingTS>_>,_std::_Select1st<std::pair<const_unsigned_short,_webfront::WebLink<webfront::networking::TCPNetworkingTS>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_webfront::WebLink<webfront::networking::TCPNetworkingTS>_>_>_>
              ::equal_range(&(this->webLinks)._M_t,&event->webLinkId);
      http::std::
      _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_webfront::WebLink<webfront::networking::TCPNetworkingTS>_>,_std::_Select1st<std::pair<const_unsigned_short,_webfront::WebLink<webfront::networking::TCPNetworkingTS>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_webfront::WebLink<webfront::networking::TCPNetworkingTS>_>_>_>
      ::_M_erase_aux(&(this->webLinks)._M_t,(_Base_ptr)pVar6.first._M_node,
                     (_Base_ptr)pVar6.second._M_node);
      return;
    }
    if (CVar1 == linked) {
      local_20._M_extent._M_extent_value._0_4_ =
           CONCAT22(local_20._M_extent._M_extent_value._2_2_,event->webLinkId);
      __k = event;
      local_20._M_ptr = (pointer)this;
      if ((this->uiStartedHandler).super__Function_base._M_manager == (_Manager_type)0x0)
      goto LAB_00118adf;
      (*(this->uiStartedHandler)._M_invoker)
                ((_Any_data *)&this->uiStartedHandler,
                 (BasicUI<webfront::BasicWF<webfront::networking::TCPNetworkingTS,_webfront::fs::Multi<webfront::fs::NativeDebugFS,_webfront::fs::IndexFS,_webfront::fs::ReactFS,_webfront::fs::BabelFS>_>_>
                  *)&local_20);
    }
  }
  return;
}

Assistant:

void onEvent(WebLinkEvent event) {
        switch (event.code) {
        case WebLinkEvent::Code::linked: uiStartedHandler(UI{*this, event.webLinkId}); break;
        case WebLinkEvent::Code::closed: webLinks.erase(event.webLinkId); break;
        case WebLinkEvent::Code::cppFunctionCalled: cppFunctions.at(event.text)(event.data); break;
        }
    }